

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O3

void __thiscall Cleaner::PrintHeader(Cleaner *this)

{
  int iVar1;
  int __c;
  
  if (*(int *)this->config_ == 1) {
    return;
  }
  printf("Cleaning...");
  iVar1 = *(int *)this->config_;
  if ((iVar1 == 1) || ((__c = 10, iVar1 != 2 && (this->config_[4] == (BuildConfig)0x0)))) {
    __c = 0x20;
  }
  putchar(__c);
  fflush(_stdout);
  return;
}

Assistant:

void Cleaner::PrintHeader() {
  if (config_.verbosity == BuildConfig::QUIET)
    return;
  printf("Cleaning...");
  if (IsVerbose())
    printf("\n");
  else
    printf(" ");
  fflush(stdout);
}